

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool CoreML::Specification::NeuralNetworkMultiArrayShapeMapping_Parse
               (ConstStringParam name,NeuralNetworkMultiArrayShapeMapping *value)

{
  bool bVar1;
  int int_value;
  StringPiece local_20;
  
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_20,name);
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((EnumEntry *)NeuralNetworkMultiArrayShapeMapping_entries,2,local_20,&int_value)
  ;
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool NeuralNetworkMultiArrayShapeMapping_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, NeuralNetworkMultiArrayShapeMapping* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      NeuralNetworkMultiArrayShapeMapping_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<NeuralNetworkMultiArrayShapeMapping>(int_value);
  }
  return success;
}